

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void my_deserialization_example(ChArchiveIn *marchive)

{
  undefined8 *mptr;
  ChStreamOutAscii *pCVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  myEmployee *a_boss;
  int m_int;
  shared_ptr<myEmployeeBoss> s_boss;
  myEmployeeCustomConstructor *mcustomconstr;
  myEmployee *a_boss2;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  shared_ptr<myEmployeeBoss> null_boss;
  vector<double,_std::allocator<double>_> m_stlvector;
  ChVector<double> *a_vect;
  pair<int,_double> m_stlpair;
  double m_double;
  ChMatrixDynamic<> m_matr_dyn;
  shared_ptr<myEmployeeBoss> s_boss_b;
  ChVector<double> m_vect;
  char m_text [12];
  string m_string;
  ChVector<double> *a_null_ptr;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  ChQuaternion<double> m_quat;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  double m_array [3];
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  local_2c8;
  ChNameValue<myEmployeeCustomConstructor_*> local_2b0;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_298;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_280;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_268;
  ChNameValue<myEmployee_*> local_250;
  ChNameValue<myEmployee_*> local_238;
  ChNameValue<chrono::ChVector<double>_*> local_220;
  ChNameValue<chrono::ChVector<double>_*> local_208;
  ChNameValue<myEmployeeBoss> local_1f0;
  ChNameValue<chrono::ChQuaternion<double>_> local_1d8;
  ChNameValue<chrono::ChVector<double>_> local_1c0;
  ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_1a8;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_190;
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_178;
  ChNameValue<std::pair<int,_double>_> local_160;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_148;
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_130;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  ChNameValue<char[12]> local_100;
  ChNameValue<double[3]> local_e8;
  ChNameValue<int> local_d0;
  ChNameValue<double> local_b8;
  myEmployeeBoss m_boss;
  
  m_string._M_dataplus._M_p = (pointer)&m_string.field_2;
  m_stlpair.first = 0;
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  m_stlpair.second = 0.0;
  m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  m_vect.m_data[2] = 0.0;
  m_string._M_string_length = 0;
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node._M_size = 0;
  m_string.field_2._M_local_buf[0] = '\0';
  m_stlunorderedmap._M_h._M_buckets = &m_stlunorderedmap._M_h._M_single_bucket;
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  m_vect.m_data[0] = 0.0;
  m_vect.m_data[1] = 0.0;
  m_stlunorderedmap._M_h._M_bucket_count = 1;
  m_stlunorderedmap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  m_stlunorderedmap._M_h._M_element_count = 0;
  m_stlunorderedmap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  m_stlunorderedmap._M_h._M_rehash_policy._M_next_resize = 0;
  m_stlunorderedmap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  m_quat.m_data = (double  [4])(ZEXT432(0) << 0x40);
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&m_stllist;
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&m_stllist;
  myEmployeeBoss::myEmployeeBoss(&m_boss,0x26,9000.4,true);
  local_b8._value = &m_double;
  local_b8._name = "custom_double";
  local_b8._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_b8);
  local_d0._value = &m_int;
  local_d0._name = "m_int";
  local_d0._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_d0);
  local_e8._value = &m_array;
  local_e8._name = "m_array";
  local_e8._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_e8);
  local_100._value = &m_text;
  local_100._name = "m_text";
  local_100._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_100);
  local_118._value = &m_string;
  local_118._name = "m_string";
  local_118._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_118);
  local_130._value = &m_stlvector;
  local_130._name = "m_stlvector";
  local_130._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_130);
  local_148._name = "m_stllist";
  local_148._flags = '\0';
  local_148._value = &m_stllist;
  chrono::ChArchiveIn::operator>>(marchive,&local_148);
  local_160._value = &m_stlpair;
  local_160._name = "m_stlpair";
  local_160._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_160);
  local_178._value = &m_stlunorderedmap;
  local_178._name = "m_stlunorderedmap";
  local_178._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_178);
  local_190._value = &m_matr_dyn;
  local_190._name = "m_matr_dyn";
  local_190._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_190);
  local_1a8._value = &m_matr_NM;
  local_1a8._name = "m_matr_NM";
  local_1a8._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_1a8);
  local_1c0._value = &m_vect;
  local_1c0._name = "m_vect";
  local_1c0._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_1c0);
  local_1d8._value = &m_quat;
  local_1d8._name = "m_quaternion";
  local_1d8._flags = '\x01';
  chrono::ChArchiveIn::operator>>(marchive,&local_1d8);
  local_1f0._name = "m_boss";
  local_1f0._flags = '\0';
  local_1f0._value = &m_boss;
  chrono::ChArchiveIn::operator>>(marchive,&local_1f0);
  local_208._value = &a_vect;
  local_208._name = "a_vect";
  local_208._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_208);
  local_220._value = &a_null_ptr;
  local_220._name = "a_null_ptr";
  local_220._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_220);
  a_boss = (myEmployee *)0x0;
  local_238._name = "a_boss";
  local_238._flags = '\0';
  local_238._value = &a_boss;
  chrono::ChArchiveIn::operator>>(marchive,&local_238);
  local_250._value = &a_boss2;
  a_boss2 = (myEmployee *)0x0;
  local_250._name = "a_boss2";
  local_250._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_250);
  local_268._value = &s_boss;
  local_268._name = "s_boss";
  s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_268);
  local_280._value = &s_boss_b;
  local_280._name = "s_boss_b";
  s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_280._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_280);
  local_298._value = &null_boss;
  local_298._name = "null_boss";
  null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_298._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_298);
  local_2b0._value = &mcustomconstr;
  mcustomconstr = (myEmployeeCustomConstructor *)0x0;
  local_2b0._name = "mcustomconstr";
  local_2b0._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_2b0);
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mptr = (undefined8 *)operator_new(0x18);
  *mptr = 0x4014000000000000;
  mptr[1] = 0x4018000000000000;
  mptr[2] = 0x401c000000000000;
  chrono::ChArchiveIn::RebindExternalPointer(marchive,mptr,0x3e9);
  local_2c8._value = &vect_of_pointers;
  local_2c8._name = "vect_of_pointers";
  local_2c8._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_2c8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar1,"\n\nSome results of deserialization I/O: \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,m_text);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,m_int);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,m_double);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_matr_NM);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_vect);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_quat);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,m_string._M_dataplus._M_p);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_stlvector);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_stlpair);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_stlunorderedmap);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&m_boss);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&a_vect);
  if (a_boss != (myEmployee *)0x0) {
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar1,"\n\n We loaded an obj inherited from myEmployee class:\n");
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar1,&a_boss);
  }
  if (a_boss2 != (myEmployee *)0x0) {
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar1,
               "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n");
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar1,&a_boss2);
  }
  if (s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar1,"\n\n We loaded a 3nd obj inherited from myEmployee class:\n");
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar1,&s_boss);
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar1 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar1,"(This object is handled by shared pointers, with ref.count=");
    if (s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count;
    }
    pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,iVar3);
    chrono::ChStreamOutAscii::operator<<(pCVar1,")\n");
  }
  if (null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar1,"\n\n We tried to load a 4th obj with shared pointer, but was null.\n");
  }
  if (mcustomconstr != (myEmployeeCustomConstructor *)0x0) {
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<
              (pCVar1,
               "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n");
    pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::operator<<(pCVar1,&mcustomconstr);
  }
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n")
  ;
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,&vect_of_pointers);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,*vect_of_pointers.
                             super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::operator<<(pCVar1,vect_of_pointers.
                            super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,"loaded object is a myEmployee?     :");
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,a_boss != (myEmployee *)0x0);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,"loaded object is a myEmployeeBoss? :");
  if (a_boss == (myEmployee *)0x0) {
    bVar4 = false;
  }
  else {
    lVar2 = __dynamic_cast(a_boss,&myEmployee::typeinfo,&myEmployeeBoss::typeinfo,0);
    bVar4 = lVar2 != 0;
  }
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,bVar4);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  if (a_boss != (myEmployee *)0x0) {
    (*a_boss->_vptr_myEmployee[1])();
  }
  std::_Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::
  ~_Vector_base(&vect_of_pointers.
                 super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s_boss_b.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  myEmployeeBoss::~myEmployeeBoss(&m_boss);
  Eigen::internal::handmade_aligned_free
            (m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&m_stlunorderedmap._M_h);
  std::__cxx11::_List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  _M_clear(&m_stllist.
            super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&m_stlvector.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&m_string);
  return;
}

Assistant:

void my_deserialization_example(ChArchiveIn& marchive)
{  
        // Read from persistent binary file to transient data
        double m_double;
        int m_int;
        double m_array[3];
        char m_text[12]; // better use std::string
        std::string m_string;
        std::vector< double > m_stlvector;
        std::list< ChVector<> > m_stllist;
        std::pair<int, double> m_stlpair;
        std::unordered_map<int, double> m_stlunorderedmap;
        ChMatrixDynamic<> m_matr_dyn;
		ChMatrixNM<double, 2,3> m_matr_NM;
        ChVector<> m_vect;
        ChQuaternion<> m_quat;
        myEmployeeBoss m_boss;
        ChVector<>* a_vect;
        ChVector<>* a_null_ptr;

        marchive >> CHNVP(m_double,"custom_double");  // deserialize data n.1
        marchive >> CHNVP(m_int);     // deserialize data n.2
        marchive >> CHNVP(m_array);   // deserialize data n.3
        marchive >> CHNVP(m_text);    // deserialize data n....
        marchive >> CHNVP(m_string);  
        marchive >> CHNVP(m_stlvector);
        marchive >> CHNVP(m_stllist);
        marchive >> CHNVP(m_stlpair);
        marchive >> CHNVP(m_stlunorderedmap);
        marchive >> CHNVP(m_matr_dyn);
		marchive >> CHNVP(m_matr_NM);
        marchive >> CHNVP(m_vect);  
        marchive >> CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);        

        // Also deserialize the C++ object
        marchive >> CHNVP(m_boss); 

        // Also deserialize the C++ pointer: an object will be created!
        marchive >> CHNVP(a_vect); 

        // Also deserialize the null C++ pointer: no object is created, and pointer set as null.
        marchive >> CHNVP(a_null_ptr);

        // Also retrieve c++ objects, referenced by a base class pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded even if we do not know if it was an object of
        // the base class 'myEmployee' or the specialized 'myEmployeeBoss' class..
        myEmployee* a_boss = 0;
        marchive >> CHNVP(a_boss);  // object will be created

        // Since the two pointers a_boss and a_boss2 were serialized when pointing to 
        // the same object instance, now the following will Not create another copy but will
        // automatically point to the same object of a_boss. 
        myEmployee* a_boss2 = 0;
        marchive >> CHNVP(a_boss2); 


        // Deserialize c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        std::shared_ptr<myEmployeeBoss> s_boss(0);
        marchive >> CHNVP(s_boss);

        // Deserialize a shared pointer pointing to the same resource of s_boss.
        // Since the two pointers s_boss and s_boss_b were serialized when pointing to 
        // the same object instance, do not create new, but just point to the same of s_boss. 
        // Also, the shared pointer reference count is increased automatically.
        std::shared_ptr<myEmployeeBoss> s_boss_b(0);
        marchive >> CHNVP(s_boss_b);

        // Deserialize a null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss(0);
        marchive >> CHNVP(null_boss);

        // Deserialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = 0;
        marchive >> CHNVP(mcustomconstr); 

        // Deserialize an object where some pointers are re-linked from external pre-existing objects,
        // marking them with unique IDs. Assume a ChVector is already here. 
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(5,6,7);
        marchive.RebindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive >> CHNVP(vect_of_pointers);



        // Just for safety, log some of the restored data:

        GetLog() << "\n\nSome results of deserialization I/O: \n\n" << m_text << " \n" << m_int << " \n" << m_double << "\n";
        GetLog() << m_matr_NM;
        GetLog() << m_vect;
        GetLog() << m_quat;
        GetLog() << m_string.c_str() << "\n";
        GetLog() << m_stlvector;
        GetLog() << m_stlpair;
        GetLog() << m_stlunorderedmap;
        GetLog() << m_boss;
        GetLog() << a_vect;

        if (a_boss) {
            GetLog() << "\n\n We loaded an obj inherited from myEmployee class:\n";
            GetLog() << a_boss;
        }
        if (a_boss2) {
            GetLog() << "\n\n We loaded a 2nd obj inherited from myEmployee class (referencing the 1st):\n";
            GetLog() << a_boss2;
        }
        if (s_boss) {
            GetLog() << "\n\n We loaded a 3nd obj inherited from myEmployee class:\n";
            GetLog() << s_boss;
            GetLog() << "(This object is handled by shared pointers, with ref.count=" << (int)s_boss.use_count() << ")\n";
        }
        if (!null_boss) {
            GetLog() << "\n\n We tried to load a 4th obj with shared pointer, but was null.\n";
        }
        if (mcustomconstr) {
            GetLog() << "\n\n We loaded a 5th object with non-default constructor with 2 parameters.\n";
            GetLog() << mcustomconstr;
        }
        GetLog() << "\n\n We loaded a 6th object where sub-objects were unbind/rebind using IDs:\n";
        GetLog() << vect_of_pointers;
        GetLog() << *vect_of_pointers[0];
        GetLog() << *vect_of_pointers[1];


        GetLog() << "\n";
        GetLog() << "loaded object is a myEmployee?     :" << (dynamic_cast<myEmployee*>(a_boss) !=nullptr) << "\n";
        GetLog() << "loaded object is a myEmployeeBoss? :" << (dynamic_cast<myEmployeeBoss*>(a_boss) !=nullptr) << "\n";

        delete a_boss;
}